

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int stumplog_set_mask(int mask)

{
  stumpless_target *target;
  int iVar1;
  
  target = stumpless_get_current_target();
  if (target == (stumpless_target *)0x0) {
    iVar1 = 0;
  }
  else {
    lock_target(target);
    iVar1 = target->mask;
    target->mask = mask;
    unlock_target(target);
  }
  return iVar1;
}

Assistant:

int
stumplog_set_mask( int mask ) {
  struct stumpless_target *target;
  int old_mask;

  target = stumpless_get_current_target(  );
  if( !target ) {
    return 0;
  }

  lock_target( target );
  old_mask = target->mask;
  target->mask = mask;
  unlock_target( target );

  return old_mask;
}